

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O0

void ncnn::resize_bicubic_image(Mat *src,Mat *dst,float *alpha,int *xofs,float *beta,int *yofs)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  long in_RCX;
  float *in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  float *in_R8;
  long in_R9;
  int dx_4;
  float *Dp;
  float *rows3p;
  float *rows2p;
  float *rows1p;
  float *rows0p;
  float b3;
  float b2;
  float b1;
  float b0;
  float a3_3;
  float a2_3;
  float a1_3;
  float a0_3;
  float *S3p_3;
  float *S2p_2;
  float *S1p_1;
  float *S0p;
  int sx_3;
  int dx_3;
  float *rows3p_4;
  float *rows2p_3;
  float *rows1p_2;
  float *rows0p_1;
  float *alphap_3;
  float *S3_3;
  float *S2_2;
  float *S1_1;
  float *S0;
  float a3_2;
  float a2_2;
  float a1_2;
  float a0_2;
  float *S3p_2;
  float *S2p_1;
  float *S1p;
  int sx_2;
  int dx_2;
  float *rows3p_3;
  float *rows2p_2;
  float *rows1p_1;
  float *alphap_2;
  float *S3_2;
  float *S2_1;
  float *S1;
  float *rows2_old;
  float *rows1_old_1;
  float *rows0_old_2;
  float a3_1;
  float a2_1;
  float a1_1;
  float a0_1;
  float *S3p_1;
  float *S2p;
  int sx_1;
  int dx_1;
  float *rows3p_2;
  float *rows2p_1;
  float *alphap_1;
  float *S3_1;
  float *S2;
  float *rows1_old;
  float *rows0_old_1;
  float a3;
  float a2;
  float a1;
  float a0;
  float *S3p;
  int sx;
  int dx;
  float *rows3p_1;
  float *alphap;
  float *S3;
  float *rows0_old;
  int sy;
  int dy;
  int prev_sy1;
  float *rows3;
  float *rows2;
  float *rows1;
  float *rows0;
  Mat rowsbuf3;
  Mat rowsbuf2;
  Mat rowsbuf1;
  Mat rowsbuf0;
  int h;
  int w;
  Allocator *in_stack_fffffffffffffc78;
  size_t in_stack_fffffffffffffc80;
  undefined8 in_stack_fffffffffffffc88;
  int iVar15;
  Mat *in_stack_fffffffffffffc90;
  int local_354;
  float *local_350;
  float *local_348;
  float *local_340;
  float *local_338;
  float *local_330;
  int local_2e4;
  float *local_2c0;
  int local_26c;
  float *local_250;
  int local_1f4;
  float *local_1e0;
  int local_19c;
  float *local_190;
  int local_170;
  int local_16c;
  float *local_168;
  float *local_160;
  float *local_158;
  float *local_150;
  Mat local_148;
  Mat local_108;
  Mat local_b8;
  Mat local_78;
  int local_38;
  int local_34;
  long local_30;
  float *local_28;
  long local_20;
  float *local_18;
  Mat *local_10;
  Mat *local_8;
  
  iVar15 = (int)((ulong)in_stack_fffffffffffffc88 >> 0x20);
  local_34 = in_RSI->w;
  local_38 = in_RSI->h;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Mat::Mat(in_stack_fffffffffffffc90,iVar15,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  Mat::Mat(in_stack_fffffffffffffc90,iVar15,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  Mat::Mat(in_stack_fffffffffffffc90,iVar15,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  Mat::Mat(in_stack_fffffffffffffc90,iVar15,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  local_150 = Mat::operator_cast_to_float_(&local_78);
  local_158 = Mat::operator_cast_to_float_(&local_b8);
  local_160 = Mat::operator_cast_to_float_(&local_108);
  local_168 = Mat::operator_cast_to_float_(&local_148);
  local_16c = -3;
  for (local_170 = 0; pfVar14 = local_150, pfVar13 = local_158, pfVar6 = local_160,
      local_170 < local_38; local_170 = local_170 + 1) {
    iVar15 = *(int *)(local_30 + (long)local_170 * 4);
    if (iVar15 != local_16c) {
      if (iVar15 == local_16c + 1) {
        local_150 = local_158;
        local_158 = local_160;
        local_160 = local_168;
        local_168 = pfVar14;
        pfVar6 = Mat::row(local_8,iVar15 + 2);
        local_190 = local_18;
        for (local_19c = 0; local_19c < local_34; local_19c = local_19c + 1) {
          pfVar13 = pfVar6 + *(int *)(local_20 + (long)local_19c * 4);
          pfVar14[local_19c] =
               pfVar13[-1] * *local_190 + *pfVar13 * local_190[1] + pfVar13[1] * local_190[2] +
               pfVar13[2] * local_190[3];
          local_190 = local_190 + 4;
        }
      }
      else if (iVar15 == local_16c + 2) {
        local_150 = local_160;
        local_158 = local_168;
        local_160 = pfVar14;
        local_168 = pfVar13;
        pfVar6 = Mat::row(local_8,iVar15 + 1);
        pfVar7 = Mat::row(local_8,iVar15 + 2);
        local_1e0 = local_18;
        for (local_1f4 = 0; local_1f4 < local_34; local_1f4 = local_1f4 + 1) {
          iVar5 = *(int *)(local_20 + (long)local_1f4 * 4);
          pfVar8 = pfVar6 + iVar5;
          pfVar9 = pfVar7 + iVar5;
          fVar1 = *local_1e0;
          fVar2 = local_1e0[1];
          fVar3 = local_1e0[2];
          fVar4 = local_1e0[3];
          pfVar14[local_1f4] =
               pfVar8[-1] * fVar1 + *pfVar8 * fVar2 + pfVar8[1] * fVar3 + pfVar8[2] * fVar4;
          pfVar13[local_1f4] =
               pfVar9[-1] * fVar1 + *pfVar9 * fVar2 + pfVar9[1] * fVar3 + pfVar9[2] * fVar4;
          local_1e0 = local_1e0 + 4;
        }
      }
      else if (iVar15 == local_16c + 3) {
        local_150 = local_168;
        local_158 = pfVar14;
        local_160 = pfVar13;
        local_168 = pfVar6;
        pfVar7 = Mat::row(local_8,iVar15);
        pfVar8 = Mat::row(local_8,iVar15 + 1);
        pfVar9 = Mat::row(local_8,iVar15 + 2);
        local_250 = local_18;
        for (local_26c = 0; local_26c < local_34; local_26c = local_26c + 1) {
          iVar5 = *(int *)(local_20 + (long)local_26c * 4);
          pfVar10 = pfVar7 + iVar5;
          pfVar11 = pfVar8 + iVar5;
          pfVar12 = pfVar9 + iVar5;
          fVar1 = *local_250;
          fVar2 = local_250[1];
          fVar3 = local_250[2];
          fVar4 = local_250[3];
          pfVar14[local_26c] =
               pfVar10[-1] * fVar1 + *pfVar10 * fVar2 + pfVar10[1] * fVar3 + pfVar10[2] * fVar4;
          pfVar13[local_26c] =
               pfVar11[-1] * fVar1 + *pfVar11 * fVar2 + pfVar11[1] * fVar3 + pfVar11[2] * fVar4;
          pfVar6[local_26c] =
               pfVar12[-1] * fVar1 + *pfVar12 * fVar2 + pfVar12[1] * fVar3 + pfVar12[2] * fVar4;
          local_250 = local_250 + 4;
        }
      }
      else {
        pfVar6 = Mat::row(local_8,iVar15 + -1);
        pfVar13 = Mat::row(local_8,iVar15);
        pfVar14 = Mat::row(local_8,iVar15 + 1);
        pfVar7 = Mat::row(local_8,iVar15 + 2);
        local_2c0 = local_18;
        for (local_2e4 = 0; local_2e4 < local_34; local_2e4 = local_2e4 + 1) {
          iVar5 = *(int *)(local_20 + (long)local_2e4 * 4);
          pfVar8 = pfVar6 + iVar5;
          pfVar9 = pfVar13 + iVar5;
          pfVar10 = pfVar14 + iVar5;
          pfVar11 = pfVar7 + iVar5;
          fVar1 = *local_2c0;
          fVar2 = local_2c0[1];
          fVar3 = local_2c0[2];
          fVar4 = local_2c0[3];
          local_150[local_2e4] =
               pfVar8[-1] * fVar1 + *pfVar8 * fVar2 + pfVar8[1] * fVar3 + pfVar8[2] * fVar4;
          local_158[local_2e4] =
               pfVar9[-1] * fVar1 + *pfVar9 * fVar2 + pfVar9[1] * fVar3 + pfVar9[2] * fVar4;
          local_160[local_2e4] =
               pfVar10[-1] * fVar1 + *pfVar10 * fVar2 + pfVar10[1] * fVar3 + pfVar10[2] * fVar4;
          local_168[local_2e4] =
               pfVar11[-1] * fVar1 + *pfVar11 * fVar2 + pfVar11[1] * fVar3 + pfVar11[2] * fVar4;
          local_2c0 = local_2c0 + 4;
        }
      }
    }
    fVar1 = *local_28;
    fVar2 = local_28[1];
    fVar3 = local_28[2];
    fVar4 = local_28[3];
    local_330 = local_150;
    local_338 = local_158;
    local_340 = local_160;
    local_348 = local_168;
    local_350 = Mat::row(local_10,local_170);
    for (local_354 = 0; local_354 < local_34; local_354 = local_354 + 1) {
      *local_350 = *local_330 * fVar1 + *local_338 * fVar2 + *local_340 * fVar3 + *local_348 * fVar4
      ;
      local_350 = local_350 + 1;
      local_348 = local_348 + 1;
      local_340 = local_340 + 1;
      local_338 = local_338 + 1;
      local_330 = local_330 + 1;
    }
    local_28 = local_28 + 4;
    local_16c = iVar15;
  }
  Mat::~Mat((Mat *)0x1a7ab3);
  Mat::~Mat((Mat *)0x1a7ac0);
  Mat::~Mat((Mat *)0x1a7acd);
  Mat::~Mat((Mat *)0x1a7ada);
  return;
}

Assistant:

static void resize_bicubic_image(const Mat& src, Mat& dst, float* alpha, int* xofs, float* beta, int* yofs)
{
    int w = dst.w;
    int h = dst.h;

    // loop body
    Mat rowsbuf0(w);
    Mat rowsbuf1(w);
    Mat rowsbuf2(w);
    Mat rowsbuf3(w);
    float* rows0 = rowsbuf0;
    float* rows1 = rowsbuf1;
    float* rows2 = rowsbuf2;
    float* rows3 = rowsbuf3;

    int prev_sy1 = -3;

    for (int dy = 0; dy < h; dy++ )
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            float* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows2;
            rows2 = rows3;
            rows3 = rows0_old;
            const float* S3 = src.row(sy+2);

            const float* alphap = alpha;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx];
                const float* S3p = S3 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                float a2 = alphap[2];
                float a3 = alphap[3];
                rows3p[dx] = S3p[-1]*a0 + S3p[0]*a1 + S3p[1]*a2 + S3p[2]*a3;

                alphap += 4;
            }
        }
        else if (sy == prev_sy1 + 2)
        {
            // hresize two rows
            float* rows0_old = rows0;
            float* rows1_old = rows1;
            rows0 = rows2;
            rows1 = rows3;
            rows2 = rows0_old;
            rows3 = rows1_old;
            const float* S2 = src.row(sy+1);
            const float* S3 = src.row(sy+2);

            const float* alphap = alpha;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx];
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                float a2 = alphap[2];
                float a3 = alphap[3];
                rows2p[dx] = S2p[-1]*a0 + S2p[0]*a1 + S2p[1]*a2 + S2p[2]*a3;
                rows3p[dx] = S3p[-1]*a0 + S3p[0]*a1 + S3p[1]*a2 + S3p[2]*a3;

                alphap += 4;
            }
        }
        else if (sy == prev_sy1 + 3)
        {
            // hresize three rows
            float* rows0_old = rows0;
            float* rows1_old = rows1;
            float* rows2_old = rows2;
            rows0 = rows3;
            rows1 = rows0_old;
            rows2 = rows1_old;
            rows3 = rows2_old;
            const float* S1 = src.row(sy);
            const float* S2 = src.row(sy+1);
            const float* S3 = src.row(sy+2);

            const float* alphap = alpha;
            float* rows1p = rows1;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx];
                const float* S1p = S1 + sx;
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                float a2 = alphap[2];
                float a3 = alphap[3];
                rows1p[dx] = S1p[-1]*a0 + S1p[0]*a1 + S1p[1]*a2 + S1p[2]*a3;
                rows2p[dx] = S2p[-1]*a0 + S2p[0]*a1 + S2p[1]*a2 + S2p[2]*a3;
                rows3p[dx] = S3p[-1]*a0 + S3p[0]*a1 + S3p[1]*a2 + S3p[2]*a3;

                alphap += 4;
            }
        }
        else
        {
            // hresize four rows
            const float* S0 = src.row(sy-1);
            const float* S1 = src.row(sy);
            const float* S2 = src.row(sy+1);
            const float* S3 = src.row(sy+2);

            const float* alphap = alpha;
            float* rows0p = rows0;
            float* rows1p = rows1;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx];
                const float* S0p = S0 + sx;
                const float* S1p = S1 + sx;
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                float a2 = alphap[2];
                float a3 = alphap[3];
                rows0p[dx] = S0p[-1]*a0 + S0p[0]*a1 + S0p[1]*a2 + S0p[2]*a3;
                rows1p[dx] = S1p[-1]*a0 + S1p[0]*a1 + S1p[1]*a2 + S1p[2]*a3;
                rows2p[dx] = S2p[-1]*a0 + S2p[0]*a1 + S2p[1]*a2 + S2p[2]*a3;
                rows3p[dx] = S3p[-1]*a0 + S3p[0]*a1 + S3p[1]*a2 + S3p[2]*a3;

                alphap += 4;
            }
        }

        prev_sy1 = sy;

        // vresize
        float b0 = beta[0];
        float b1 = beta[1];
        float b2 = beta[2];
        float b3 = beta[3];

        float* rows0p = rows0;
        float* rows1p = rows1;
        float* rows2p = rows2;
        float* rows3p = rows3;
        float* Dp = dst.row(dy);
        for (int dx = 0; dx < w; dx++)
        {
//             D[x] = rows0[x]*b0 + rows1[x]*b1 + rows2[x]*b2 + rows3[x]*b3;
            *Dp++ = *rows0p++ * b0 + *rows1p++ * b1 + *rows2p++ * b2 + *rows3p++ * b3;
        }

        beta += 4;
    }
}